

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::DataParameter::SharedCtor(DataParameter *this)

{
  this->_cached_size_ = 0;
  (this->source_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  (this->mean_file_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  this->batch_size_ = 0;
  this->crop_size_ = 0;
  this->rand_skip_ = 0;
  this->mirror_ = false;
  this->force_encoded_color_ = false;
  *(undefined2 *)&this->field_0x36 = 0;
  this->backend_ = 0;
  this->scale_ = 1.0;
  this->prefetch_ = 4;
  return;
}

Assistant:

void DataParameter::SharedCtor() {
  _cached_size_ = 0;
  source_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  mean_file_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  ::memset(&batch_size_, 0, reinterpret_cast<char*>(&backend_) -
    reinterpret_cast<char*>(&batch_size_) + sizeof(backend_));
  scale_ = 1;
  prefetch_ = 4u;
}